

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void gamma_transform_test
               (png_modifier *pm,png_byte colour_type,png_byte bit_depth,int palette_number,
               int interlace_type,double file_gamma,double screen_gamma,png_byte sbit,
               int use_input_precision,int scale16)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  undefined7 in_register_00000089;
  bool bVar7;
  undefined4 in_stack_ffffffffffffff68;
  char name [64];
  
  if ((png_byte)interlace_type == colour_type || interlace_type == 0) {
    cVar1 = 'g';
    lVar6 = 0;
    do {
      name[lVar6] = cVar1;
      cVar1 = "gamma "[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    name[6] = '\0';
    sVar5 = 6;
  }
  else {
    cVar1 = 's';
    lVar6 = 0;
    do {
      name[lVar6] = cVar1;
      cVar1 = ", sbit("[lVar6 + 3];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
    name[5] = '\0';
    sVar2 = safecatn(name,0x40,5,interlace_type & 0xffU);
    bVar7 = sVar2 < 0x40;
    if (bVar7) {
      cVar1 = ')';
      lVar6 = 0;
      do {
        uVar4 = sVar2;
        name[uVar4] = cVar1;
        if (uVar4 == 0x3f) {
          sVar2 = 0x40;
          break;
        }
        cVar1 = ") "[lVar6 + 1];
        lVar6 = lVar6 + 1;
        sVar2 = uVar4 + 1;
      } while (lVar6 != 2);
      bVar7 = uVar4 < 0x3f;
    }
    sVar5 = 0x3f;
    if (bVar7) {
      sVar5 = sVar2;
    }
    name[sVar5] = '\0';
  }
  uVar4 = sVar5;
  if (use_input_precision != 0) {
    bVar7 = sVar5 < 0x40;
    if (bVar7) {
      cVar1 = '1';
      lVar6 = 0;
      do {
        lVar3 = lVar6;
        name[lVar3 + sVar5] = cVar1;
        if (lVar3 + sVar5 == 0x3f) {
          uVar4 = 0x40;
          goto LAB_00114703;
        }
        cVar1 = "16to8 "[lVar3 + 1];
        lVar6 = lVar3 + 1;
      } while (lVar3 + 1 != 6);
      uVar4 = sVar5 + 6;
LAB_00114703:
      bVar7 = lVar3 + sVar5 + 1 < 0x40;
    }
    if (!bVar7) {
      uVar4 = 0x3f;
    }
    name[uVar4] = '\0';
  }
  sVar5 = safecatd(name,0x40,uVar4,file_gamma,3);
  bVar7 = sVar5 < 0x40;
  if (bVar7) {
    cVar1 = '-';
    lVar6 = 0;
    do {
      uVar4 = sVar5;
      name[uVar4] = cVar1;
      if (uVar4 == 0x3f) {
        sVar5 = 0x40;
        break;
      }
      cVar1 = "->"[lVar6 + 1];
      lVar6 = lVar6 + 1;
      sVar5 = uVar4 + 1;
    } while (lVar6 != 2);
    bVar7 = uVar4 < 0x3f;
  }
  sVar2 = 0x3f;
  if (bVar7) {
    sVar2 = sVar5;
  }
  name[sVar2] = '\0';
  safecatd(name,0x40,sVar2,screen_gamma,3);
  gamma_test((png_modifier *)((ulong)pm & 0xff),colour_type,bit_depth,palette_number,
             interlace_type & 0xffU,file_gamma,screen_gamma,'\0',(int)name,
             (char *)CONCAT71(in_register_00000089,sbit),use_input_precision,
             (uint)::pm._1596_4_ >> 0x18 & 1,0,0,
             (png_color_16 *)CONCAT44(palette_number,in_stack_ffffffffffffff68),0.0);
  return;
}

Assistant:

static void gamma_transform_test(png_modifier *pm,
   png_byte colour_type, png_byte bit_depth,
   int palette_number,
   int interlace_type, const double file_gamma,
   const double screen_gamma, png_byte sbit,
   int use_input_precision, int scale16)
{
   size_t pos = 0;
   char name[64];

   if (sbit != bit_depth && sbit != 0)
   {
      pos = safecat(name, sizeof name, pos, "sbit(");
      pos = safecatn(name, sizeof name, pos, sbit);
      pos = safecat(name, sizeof name, pos, ") ");
   }

   else
      pos = safecat(name, sizeof name, pos, "gamma ");

   if (scale16)
      pos = safecat(name, sizeof name, pos, "16to8 ");

   pos = safecatd(name, sizeof name, pos, file_gamma, 3);
   pos = safecat(name, sizeof name, pos, "->");
   pos = safecatd(name, sizeof name, pos, screen_gamma, 3);

   gamma_test(pm, colour_type, bit_depth, palette_number, interlace_type,
      file_gamma, screen_gamma, sbit, 0, name, use_input_precision,
      scale16, pm->test_gamma_expand16, 0 , 0, 0);
}